

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O3

void Omega_h::add_implied_metric_based_on_target(Mesh *mesh)

{
  Int IVar1;
  TagBase *this;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"target_metric","");
  this = Mesh::get_tagbase(mesh,0,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((uint)mesh->dim_ < 4) {
    if ((1 < (uint)mesh->dim_) && (IVar1 = TagBase::ncomps(this), IVar1 == 1)) {
      add_implied_isos_tag(mesh);
      return;
    }
    add_implied_metric_tag(mesh);
    return;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void add_implied_metric_based_on_target(Mesh* mesh) {
  auto target_tagbase = mesh->get_tagbase(VERT, "target_metric");
  if (mesh->dim() > 1 && target_tagbase->ncomps() == 1) {
    add_implied_isos_tag(mesh);
  } else {
    add_implied_metric_tag(mesh);
  }
}